

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_Type.cpp
# Opt level: O3

Type * __thiscall soul::Type::removeConstIfPresent(Type *this)

{
  Structure *pSVar1;
  Category CVar2;
  bool bVar3;
  bool bVar4;
  PrimitiveType PVar5;
  BoundedIntSize BVar6;
  Type *t;
  Type *in_RDI;
  
  CVar2 = this->arrayElementCategory;
  bVar3 = this->isRef;
  bVar4 = this->isConstant;
  PVar5.type = (this->primitiveType).type;
  in_RDI->category = this->category;
  in_RDI->arrayElementCategory = CVar2;
  in_RDI->isRef = bVar3;
  in_RDI->isConstant = bVar4;
  in_RDI->primitiveType = (PrimitiveType)PVar5.type;
  BVar6 = this->arrayElementBoundingSize;
  in_RDI->boundingSize = this->boundingSize;
  in_RDI->arrayElementBoundingSize = BVar6;
  pSVar1 = (this->structure).object;
  (in_RDI->structure).object = pSVar1;
  if (pSVar1 != (Structure *)0x0) {
    (pSVar1->super_RefCountedObject).refCount = (pSVar1->super_RefCountedObject).refCount + 1;
  }
  in_RDI->isConstant = false;
  return in_RDI;
}

Assistant:

Type Type::removeConstIfPresent() const      { auto t = *this; t.isConstant = false; return t; }